

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ModuleEvent>::destruct(BasicTypeInfo<dap::ModuleEvent> *this,void *ptr)

{
  ModuleEvent::~ModuleEvent((ModuleEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }